

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

Kit_DsdMan_t * Kit_DsdManAlloc(int nVars,int nNodes)

{
  void *pvVar1;
  Kit_DsdMan_t *pKVar2;
  Vec_Ptr_t *pVVar3;
  CloudManager *pCVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int nWords;
  uint nWords_00;
  ulong uVar10;
  
  pKVar2 = (Kit_DsdMan_t *)calloc(1,0x30);
  pKVar2->nVars = nVars;
  nWords_00 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    nWords_00 = 1;
  }
  pKVar2->nWords = nWords_00;
  pVVar3 = Vec_PtrAllocSimInfo(nVars,nWords_00);
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)nWords_00) {
    uVar9 = (ulong)nWords_00;
  }
  uVar10 = (ulong)(uint)nVars;
  if (nVars < 1) {
    uVar10 = uVar8;
  }
  for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
    pvVar1 = pVVar3->pArray[uVar8];
    if (uVar8 < 5) {
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        *(undefined4 *)((long)pvVar1 + uVar7 * 4) = (&DAT_00829680)[uVar8];
      }
    }
    else {
      for (uVar7 = 0; uVar9 != uVar7; uVar7 = uVar7 + 1) {
        *(uint *)((long)pvVar1 + uVar7 * 4) =
             -(uint)((1 << ((char)uVar8 - 5U & 0x1f) & (uint)uVar7) != 0);
      }
    }
  }
  pKVar2->vTtElems = pVVar3;
  pVVar3 = Vec_PtrAllocSimInfo(nNodes,nWords_00);
  pKVar2->vTtNodes = pVVar3;
  pCVar4 = Cloud_Init(0x10,0xe);
  pKVar2->dd = pCVar4;
  pVVar3 = Vec_PtrAllocSimInfo(0x1000,nWords_00);
  pKVar2->vTtBdds = pVVar3;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0x200;
  pVVar5->nSize = 0;
  piVar6 = (int *)malloc(0x800);
  pVVar5->pArray = piVar6;
  pKVar2->vNodes = pVVar5;
  return pKVar2;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the DSD manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_DsdMan_t * Kit_DsdManAlloc( int nVars, int nNodes )
{
    Kit_DsdMan_t * p;
    p = ABC_ALLOC( Kit_DsdMan_t, 1 );
    memset( p, 0, sizeof(Kit_DsdMan_t) );
    p->nVars    = nVars;
    p->nWords   = Kit_TruthWordNum( p->nVars );
    p->vTtElems = Vec_PtrAllocTruthTables( p->nVars );
    p->vTtNodes = Vec_PtrAllocSimInfo( nNodes, p->nWords );
    p->dd       = Cloud_Init( 16, 14 );
    p->vTtBdds  = Vec_PtrAllocSimInfo( (1<<12), p->nWords );
    p->vNodes   = Vec_IntAlloc( 512 );
    return p;
}